

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<IndexIntervalTest_ValuesSetInConstructor_Test>::CreateTest
          (TestFactoryImpl<IndexIntervalTest_ValuesSetInConstructor_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x38);
  Test::Test(this_00);
  this_00[2]._vptr_Test = (_func_int **)0x0;
  this_00[2].gtest_flag_saver_ = (GTestFlagSaver *)0x0;
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00[1].gtest_flag_saver_ = (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[3]._vptr_Test = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_001f8ec8;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }